

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewConversion.h
# Opt level: O0

vector<int,_std::allocator<int>_> *
gmlc::utilities::str2vector<int>(string_view line,int defValue,string_view delimiters)

{
  string_view delimiters_00;
  string_view str_00;
  string_view str_01;
  string_view V;
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  vector<int,_std::allocator<int>_> *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> *str;
  iterator __end2;
  iterator __begin2;
  string_viewVector *__range2;
  string_viewVector tempVec;
  vector<int,_std::allocator<int>_> *av;
  undefined4 in_stack_fffffffffffffef8;
  delimiter_compression in_stack_fffffffffffffefc;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *pvVar4;
  vector<int,_std::allocator<int>_> *this;
  char *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff30;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_70 [2];
  string_view local_40;
  size_t local_18;
  char *pcStack_10;
  
  str_01._M_len._4_4_ = in_stack_ffffffffffffff2c;
  str_01._M_len._0_4_ = in_stack_ffffffffffffff28;
  str_01._M_str = (char *)in_stack_ffffffffffffff30;
  this = in_RDI;
  local_40 = string_viewOps::removeBrackets(str_01);
  local_18 = local_40._M_len;
  pcStack_10 = local_40._M_str;
  pvVar4 = local_70;
  str_00._M_str = in_stack_ffffffffffffff18;
  str_00._M_len = (size_t)this;
  delimiters_00._M_str = (char *)pvVar4;
  delimiters_00._M_len = (size_t)in_RDI;
  string_viewOps::split(str_00,delimiters_00,in_stack_fffffffffffffefc);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x602c76);
  CLI::std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::size(pvVar4);
  CLI::std::vector<int,_std::allocator<int>_>::reserve
            (in_stack_ffffffffffffff30,CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
            );
  pvVar4 = local_70;
  iVar2 = CLI::std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::begin((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  iVar3 = CLI::std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::end((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  while (bVar1 = __gnu_cxx::
                 operator==<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                           ((__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                             *)in_RDI,
                            (__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::operator*((__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                 *)&stack0xffffffffffffff40);
    V._M_str = (char *)pvVar4;
    V._M_len = (size_t)iVar2._M_current;
    in_stack_fffffffffffffefc = numeric_conversion<int>(V,(int)((ulong)iVar3._M_current >> 0x20));
    CLI::std::vector<int,_std::allocator<int>_>::push_back
              (in_RDI,(value_type_conflict1 *)
                      CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    __gnu_cxx::
    __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::operator++((__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                  *)&stack0xffffffffffffff40);
  }
  CLI::std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *)this);
  return in_RDI;
}

Assistant:

std::vector<X> str2vector(
    std::string_view line,
    const X defValue,
    std::string_view delimiters = string_viewOps::default_delim_chars)
{
    line = utilities::string_viewOps::removeBrackets(line);
    auto tempVec = utilities::string_viewOps::split(line, delimiters);
    std::vector<X> av;
    av.reserve(tempVec.size());
    for (const auto& str : tempVec) {
        av.push_back(numeric_conversion<X>(str, defValue));
    }
    return av;
}